

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::serialize
          (AbstractNumericFacetValidator *this,XSerializeEngine *serEng)

{
  AbstractNumericFacetValidator *this_00;
  int nType;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&nType);
    DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
    loadClusive(this,serEng,&this->fMaxInclusiveInherited,&this->fMaxInclusive,nType,1);
    loadClusive(this,serEng,&this->fMaxExclusiveInherited,&this->fMaxExclusive,nType,2);
    loadClusive(this,serEng,&this->fMinInclusiveInherited,&this->fMinInclusive,nType,3);
    loadClusive(this,serEng,&this->fMinExclusiveInherited,&this->fMinExclusive,nType,4);
    XSerializeEngine::operator>>(serEng,&this->fEnumerationInherited);
    XTemplateSerializer::loadObject(&this->fStrEnumeration,8,true,serEng);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,nType,serEng);
    return;
  }
  this_00 = this;
  DatatypeValidator::serialize(&this->super_DatatypeValidator,serEng);
  storeClusive(this_00,serEng,this->fMaxInclusiveInherited,this->fMaxInclusive);
  storeClusive(this_00,serEng,this->fMaxExclusiveInherited,this->fMaxExclusive);
  storeClusive(this_00,serEng,this->fMinInclusiveInherited,this->fMinInclusive);
  storeClusive(this_00,serEng,this->fMinExclusiveInherited,this->fMinExclusive);
  XSerializeEngine::operator<<(serEng,this->fEnumerationInherited);
  XTemplateSerializer::storeObject(this->fStrEnumeration,serEng);
  XTemplateSerializer::storeObject(this->fEnumeration,serEng);
  return;
}

Assistant:

void AbstractNumericFacetValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {

        /***
         * don't move this line out of the if statement,
         * it is done purposely to allow AbstractNumericFacetValidator
         * read the number type information before DatatypeValidator
         * during loading
         ***/
        DatatypeValidator::serialize(serEng);

        // need not write type info for the XMLNumber since
        // the derivative class has done that       
        storeClusive(serEng, fMaxInclusiveInherited, fMaxInclusive);
        storeClusive(serEng, fMaxExclusiveInherited, fMaxExclusive);
        storeClusive(serEng, fMinInclusiveInherited, fMinInclusive);
        storeClusive(serEng, fMinExclusiveInherited, fMinExclusive);

        serEng<<fEnumerationInherited;

        /***
         * Serialize RefArrayVectorOf<XMLCh>
         * Serialize RefVectorOf<XMLNumber>
         ***/
        XTemplateSerializer::storeObject(fStrEnumeration, serEng);
        XTemplateSerializer::storeObject(fEnumeration, serEng);
   
    }
    else
    {
        // Read the number type info for the XMLNumber FIRST!!!
        int                     nType;
        XMLNumber::NumberType   numType;
        serEng>>nType;
        numType = (XMLNumber::NumberType) nType;

        DatatypeValidator::serialize(serEng);

        loadClusive(serEng, fMaxInclusiveInherited, fMaxInclusive, numType, 1);
        loadClusive(serEng, fMaxExclusiveInherited, fMaxExclusive, numType, 2);
        loadClusive(serEng, fMinInclusiveInherited, fMinInclusive, numType, 3);
        loadClusive(serEng, fMinExclusiveInherited, fMinExclusive, numType, 4);

        serEng>>fEnumerationInherited;

        /***
         *  Deserialize RefArrayVectorOf<XMLCh>         
         *  Deserialize RefVectorOf<XMLNumber>   
         ***/
        XTemplateSerializer::loadObject(&fStrEnumeration, 8, true, serEng);
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, numType, serEng);

    }

}